

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quaternion_motion_blur_device.cpp
# Opt level: O0

void device_render(int *pixels,uint width,uint height,float time,ISPCCamera *camera)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined8 *puVar9;
  undefined8 *in_RCX;
  int in_EDX;
  int in_ESI;
  float in_XMM0_Da;
  float fVar10;
  uint i_1;
  bool camera_changed;
  uint i;
  size_t in_stack_fffffffffffffb78;
  undefined7 in_stack_fffffffffffffb80;
  undefined1 in_stack_fffffffffffffb87;
  byte bVar11;
  uint local_45c;
  undefined1 local_448 [32];
  undefined1 local_428 [32];
  undefined1 local_408 [32];
  undefined1 local_3e8 [32];
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  uint local_3b4;
  undefined8 *local_3b0;
  int local_3a0;
  int local_39c;
  undefined8 *local_2c0;
  undefined8 *local_2b8;
  undefined4 local_2ac;
  float local_2a8;
  undefined4 local_2a4;
  undefined8 *local_2a0;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  float local_88;
  float fStack_84;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  
  _DAT_0060a420 = g_spp;
  DAT_0060a424 = g_motion_blur;
  DAT_0060a428 = g_time;
  _DAT_0060a42c = g_shutter_close;
  local_3b0 = in_RCX;
  local_3a0 = in_EDX;
  local_39c = in_ESI;
  if (g_animate) {
    fVar10 = cosf(in_XMM0_Da);
    DAT_0060a428 = fVar10 * 0.5 + 0.5;
    local_2ac = 0x40800000;
    local_2a8 = DAT_0060a428;
    _DAT_0060a42c = powf(DAT_0060a428,4.0);
    g_reset = true;
  }
  if ((DAT_0060a438 != local_39c) || (DAT_0060a43c != local_3a0)) {
    embree::alignedUSMFree((void *)0x1343a5);
    DAT_0060a430 = embree::alignedUSMMalloc
                             (CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                              in_stack_fffffffffffffb78,DEFAULT);
    DAT_0060a438 = local_39c;
    DAT_0060a43c = local_3a0;
    for (local_3b4 = 0; local_3b4 < (uint)(local_39c * local_3a0); local_3b4 = local_3b4 + 1) {
      local_2a0 = &local_3c8;
      local_2a4 = 0;
      local_118 = 0;
      local_128 = 0;
      uStack_124 = 0;
      uStack_120 = 0;
      uStack_11c = 0;
      local_3c8 = 0;
      uStack_3c0 = 0;
      local_2b8 = (undefined8 *)((long)DAT_0060a430 + (ulong)local_3b4 * 0x10);
      local_2c0 = &local_3c8;
      *local_2b8 = 0;
      local_2b8[1] = 0;
    }
  }
  if (((g_changed & 1U) != 0) || ((g_reset & 1U) != 0)) {
    embree::updateTransformation();
    rtcCommitScene(embree::data);
    _DAT_0060a410 = rtcGetSceneTraversable(embree::data);
  }
  bVar11 = 1;
  if ((g_changed & 1U) == 0) {
    bVar11 = g_reset;
  }
  g_changed = false;
  g_reset = false;
  local_18 = (float)_DAT_0060a450;
  fStack_14 = (float)((ulong)_DAT_0060a450 >> 0x20);
  fStack_10 = (float)uRam000000000060a458;
  fStack_c = (float)(uRam000000000060a458 >> 0x20);
  local_28 = (float)*local_3b0;
  fStack_24 = (float)((ulong)*local_3b0 >> 0x20);
  auVar4._4_4_ = -(uint)(fStack_14 != fStack_24);
  auVar4._0_4_ = -(uint)(local_18 != local_28);
  auVar4._8_4_ = -(uint)(fStack_10 != *(float *)(local_3b0 + 1));
  auVar4._12_4_ = -(uint)(fStack_c != 0.0);
  uVar5 = movmskps((int)local_3e8,auVar4);
  _DAT_0060a450 = *local_3b0;
  uRam000000000060a458 = (ulong)*(uint *)(local_3b0 + 1);
  local_38 = (float)_DAT_0060a460;
  fStack_34 = (float)((ulong)_DAT_0060a460 >> 0x20);
  fStack_30 = (float)uRam000000000060a468;
  fStack_2c = (float)(uRam000000000060a468 >> 0x20);
  local_48 = (float)*(undefined8 *)((long)local_3b0 + 0xc);
  fStack_44 = (float)((ulong)*(undefined8 *)((long)local_3b0 + 0xc) >> 0x20);
  auVar3._4_4_ = -(uint)(fStack_34 != fStack_44);
  auVar3._0_4_ = -(uint)(local_38 != local_48);
  auVar3._8_4_ = -(uint)(fStack_30 != *(float *)((long)local_3b0 + 0x14));
  auVar3._12_4_ = -(uint)(fStack_2c != 0.0);
  uVar6 = movmskps((int)local_408,auVar3);
  _DAT_0060a460 = *(undefined8 *)((long)local_3b0 + 0xc);
  uRam000000000060a468 = (ulong)*(uint *)((long)local_3b0 + 0x14);
  local_58 = (float)_DAT_0060a470;
  fStack_54 = (float)((ulong)_DAT_0060a470 >> 0x20);
  fStack_50 = (float)uRam000000000060a478;
  fStack_4c = (float)(uRam000000000060a478 >> 0x20);
  local_68 = (float)local_3b0[3];
  fStack_64 = (float)((ulong)local_3b0[3] >> 0x20);
  auVar2._4_4_ = -(uint)(fStack_54 != fStack_64);
  auVar2._0_4_ = -(uint)(local_58 != local_68);
  auVar2._8_4_ = -(uint)(fStack_50 != *(float *)(local_3b0 + 4));
  auVar2._12_4_ = -(uint)(fStack_4c != 0.0);
  uVar7 = movmskps((int)local_428,auVar2);
  _DAT_0060a470 = local_3b0[3];
  uRam000000000060a478 = (ulong)*(uint *)(local_3b0 + 4);
  local_78 = (float)_DAT_0060a480;
  fStack_74 = (float)((ulong)_DAT_0060a480 >> 0x20);
  fStack_70 = (float)uRam000000000060a488;
  fStack_6c = (float)(uRam000000000060a488 >> 0x20);
  local_88 = (float)*(undefined8 *)((long)local_3b0 + 0x24);
  fStack_84 = (float)((ulong)*(undefined8 *)((long)local_3b0 + 0x24) >> 0x20);
  auVar1._4_4_ = -(uint)(fStack_74 != fStack_84);
  auVar1._0_4_ = -(uint)(local_78 != local_88);
  auVar1._8_4_ = -(uint)(fStack_70 != *(float *)((long)local_3b0 + 0x2c));
  auVar1._12_4_ = -(uint)(fStack_6c != 0.0);
  uVar8 = movmskps((int)local_448,auVar1);
  _DAT_0060a480 = *(undefined8 *)((long)local_3b0 + 0x24);
  uRam000000000060a488 = (ulong)*(uint *)((long)local_3b0 + 0x2c);
  if (((((bVar11 & 1) == 0 && (uVar5 & 7) == 0) && (uVar6 & 7) == 0) && (uVar7 & 7) == 0) &&
      (uVar8 & 7) == 0) {
    DAT_0060a440 = DAT_0060a440 + 1;
  }
  else {
    DAT_0060a440 = 0;
    for (local_45c = 0; local_45c < (uint)(local_39c * local_3a0); local_45c = local_45c + 1) {
      puVar9 = (undefined8 *)((long)DAT_0060a430 + (ulong)local_45c * 0x10);
      *puVar9 = 0;
      puVar9[1] = 0;
    }
  }
  return;
}

Assistant:

void device_render (int* pixels,
                           const unsigned int width,
                           const unsigned int height,
                           const float time,
                           const ISPCCamera& camera)
{
  data.g_spp = g_spp;
  data.g_motion_blur = g_motion_blur;
  data.g_time = g_time;
  data.g_shutter_close = g_shutter_close;

  if (g_animate) {
    data.g_time = 0.5f * cos(time) + 0.5f;
    data.g_shutter_close = pow(data.g_time, 4.f);
    g_reset = true;
  }

  if (data.g_accu_width != width || data.g_accu_height != height) {
    alignedUSMFree(data.g_accu);
    data.g_accu = (Vec3ff*) alignedUSMMalloc((width*height)*sizeof(Vec3ff),16,EmbreeUSMMode::DEVICE_READ_WRITE);
    data.g_accu_width = width;
    data.g_accu_height = height;
    for (unsigned int i=0; i<width*height; i++)
      data.g_accu[i] = Vec3ff(0.0f);
  }

  if (g_changed || g_reset)
  {
    updateTransformation();
    rtcCommitScene(data.g_scene);
    data.g_traversable = rtcGetSceneTraversable(data.g_scene);
  }


  /* reset accumulator */
  bool camera_changed = g_changed || g_reset; g_changed = false; g_reset = false;
  camera_changed |= ne(data.g_accu_vx,camera.xfm.l.vx); data.g_accu_vx = camera.xfm.l.vx;
  camera_changed |= ne(data.g_accu_vy,camera.xfm.l.vy); data.g_accu_vy = camera.xfm.l.vy;
  camera_changed |= ne(data.g_accu_vz,camera.xfm.l.vz); data.g_accu_vz = camera.xfm.l.vz;
  camera_changed |= ne(data.g_accu_p, camera.xfm.p);    data.g_accu_p  = camera.xfm.p;
  if (camera_changed) {
    data.g_accu_count=0;
    for (unsigned int i=0; i<width*height; i++)
      data.g_accu[i] = Vec3ff(0.0f);
  }
  else {
    data.g_accu_count++;
  }
}